

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData * cfd::core::CryptoUtil::DecodeBase58Check(ByteData *__return_storage_ptr__,string *str)

{
  char *str_in;
  CfdException *this;
  size_type len;
  undefined8 uVar1;
  allocator_type *in_stack_ffffffffffffff30;
  string *message;
  size_type in_stack_ffffffffffffff38;
  CfdError error_code;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff40;
  allocator local_91;
  string local_90 [32];
  CfdSourceLocation local_70;
  int local_54;
  size_t sStack_50;
  int ret;
  size_t written;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  string *str_local;
  
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)str;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x40e304);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x40e324);
  sStack_50 = 0;
  str_in = (char *)::std::__cxx11::string::data();
  message = (string *)local_30;
  this = (CfdException *)
         ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x40e34c);
  len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  local_54 = wally_base58_to_bytes(str_in,1,(uchar *)this,len,&stack0xffffffffffffffb0);
  if (local_54 != 0) {
    local_70.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    error_code = (CfdError)((ulong)str_in >> 0x20);
    local_70.filename = local_70.filename + 1;
    local_70.line = 0x3f2;
    local_70.funcname = "DecodeBase58Check";
    logger::warn<int&>(&local_70,"wally_base58_to_bytes NG[{}].",&local_54);
    uVar1 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_90,"Decode base58 error.",&local_91);
    CfdException::CfdException(this,error_code,message);
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,(size_type)str_in);
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  return __return_storage_ptr__;
}

Assistant:

ByteData CryptoUtil::DecodeBase58Check(const std::string &str) {
  std::vector<uint8_t> output(1024);
  size_t written = 0;

  int ret = wally_base58_to_bytes(
      str.data(), BASE58_FLAG_CHECKSUM, output.data(), output.size(),
      &written);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_base58_to_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "Decode base58 error.");
  }

  output.resize(written);
  return ByteData(output);
}